

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine_unix.cpp
# Opt level: O1

bool __thiscall
QFSFileEnginePrivate::nativeOpen
          (QFSFileEnginePrivate *this,OpenMode openMode,
          optional<QFlags<QFileDevice::Permission>_> permissions)

{
  bool bVar1;
  mode_t mode;
  
  mode = 0x1b6;
  if (((ulong)permissions.super__Optional_base<QFlags<QFileDevice::Permission>,_true,_true>.
              _M_payload.super__Optional_payload_base<QFlags<QFileDevice::Permission>_> >> 0x20 & 1)
      != 0) {
    mode = QtPrivate::toMode_t(permissions.
                               super__Optional_base<QFlags<QFileDevice::Permission>,_true,_true>.
                               _M_payload.
                               super__Optional_payload_base<QFlags<QFileDevice::Permission>_>.
                               _M_payload._M_value);
  }
  bVar1 = nativeOpenImpl(this,openMode,mode);
  return bVar1;
}

Assistant:

bool QFSFileEnginePrivate::nativeOpen(QIODevice::OpenMode openMode,
                                      std::optional<QFile::Permissions> permissions)
{
    return nativeOpenImpl(openMode, permissions ? QtPrivate::toMode_t(*permissions) : 0666);
}